

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenStructReader(SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  BaseType BVar2;
  int iVar3;
  FieldDef *pFVar4;
  StructDef *pSVar5;
  Value *pVVar6;
  char *pcVar7;
  pointer ppFVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string field_var;
  string constructor;
  int padding_id;
  string type;
  string valueType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  main_constructor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_constructor;
  string local_388;
  string local_368;
  StructDef *local_348;
  int local_33c;
  string local_338;
  IdlNamer *local_318;
  string local_310;
  string local_2f0;
  pointer local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((((this->super_BaseGenerator).parser_)->opts).swift_implementation_only == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"private",(allocator<char> *)&local_388);
    pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(struct_def->super_Definition).attributes,&local_368);
    pcVar7 = "internal";
    if (pVVar6 == (Value *)0x0) {
      pcVar7 = "public";
    }
    std::__cxx11::string::~string((string *)&local_368);
  }
  else {
    pcVar7 = "internal";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"ACCESS_TYPE",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,pcVar7,(allocator<char> *)&local_310);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_368,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  GenComment(this,&(struct_def->super_Definition).doc_comment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"STRUCTNAME",(allocator<char> *)&local_338);
  local_318 = &this->namer_;
  IdlNamer::NamespacedType_abi_cxx11_(&local_388,local_318,&struct_def->super_Definition);
  CodeWriter::SetValue(this_00,&local_368,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "{{ACCESS_TYPE}} struct {{STRUCTNAME}}: NativeStruct, Verifiable, FlatbuffersInitializable\\"
             ,(allocator<char> *)&local_368);
  CodeWriter::operator+=(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,", NativeObject\\",(allocator<char> *)&local_368);
    CodeWriter::operator+=(this_00,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130," {",(allocator<char> *)&local_368);
  CodeWriter::operator+=(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"",(allocator<char> *)&local_368);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  ValidateFunc_abi_cxx11_(&local_b0,this);
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"",(allocator<char> *)&local_368);
  CodeWriter::operator+=(this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  local_33c = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"",(allocator<char> *)&local_388);
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348 = struct_def;
  for (ppFVar8 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar5 = local_348,
      ppFVar8 !=
      (local_348->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar8 = ppFVar8 + 1) {
    pFVar4 = *ppFVar8;
    if (pFVar4->deprecated == false) {
      local_2d0 = ppFVar8;
      if (local_368._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_368);
      }
      (*(local_318->super_Namer)._vptr_Namer[7])(&local_388,local_318,pFVar4);
      GenType_abi_cxx11_(&local_338,this,&(pFVar4->value).type,false);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"FIELDVAR",(allocator<char> *)&local_2f0);
      CodeWriter::SetValue(this_00,&local_310,&local_388);
      std::__cxx11::string::~string((string *)&local_310);
      if (((pFVar4->value).type.enum_def != (EnumDef *)0x0) &&
         ((pFVar4->value).type.base_type - BASE_TYPE_UTYPE < 10)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"BASEVALUE",(allocator<char> *)&local_190);
        GenTypeBasic_abi_cxx11_(&local_2f0,this,&(pFVar4->value).type,false);
        CodeWriter::SetValue(this_00,&local_310,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"VALUETYPE",(allocator<char> *)&local_2f0);
      CodeWriter::SetValue(this_00,&local_310,&local_338);
      std::__cxx11::string::~string((string *)&local_310);
      GenComment(this,&(pFVar4->super_Definition).doc_comment);
      pcVar7 = "{{VALUETYPE}}";
      if ((pFVar4->value).type.base_type - BASE_TYPE_UTYPE < 10) {
        pcVar7 = "{{BASEVALUE}}";
      }
      if ((pFVar4->value).type.enum_def == (EnumDef *)0x0) {
        pcVar7 = "{{VALUETYPE}}";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,pcVar7,(allocator<char> *)&local_2f0);
      std::operator+(&local_50,"private var _{{FIELDVAR}}: ",&local_310);
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      BVar2 = (pFVar4->value).type.base_type;
      pcVar7 = "";
      if (BVar2 - BASE_TYPE_UTYPE < 10) {
        pcVar7 = ".value";
      }
      if ((pFVar4->value).type.enum_def == (EnumDef *)0x0) {
        pcVar7 = "";
      }
      if ((BVar2 == BASE_TYPE_STRUCT) && (((pFVar4->value).type.struct_def)->fixed == true)) {
        std::operator+(&local_2f0,&local_338,"()");
      }
      else {
        SwiftConstant_abi_cxx11_(&local_2f0,this,pFVar4);
      }
      std::operator+(&local_d0,"_",&local_388);
      std::operator+(&local_290,&local_d0," = ");
      std::operator+(&local_1b0,&local_290,&local_388);
      std::operator+(&local_190,&local_1b0,pcVar7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2c8,
                 &local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_d0);
      std::operator+(&local_290,"_",&local_388);
      std::operator+(&local_1b0,&local_290," = ");
      ppFVar8 = local_2d0;
      std::operator+(&local_190,&local_1b0,&local_2f0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                 &local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_290);
      if (pFVar4->padding != 0) {
        GenPadding(this,pFVar4,&local_33c);
      }
      std::operator+(&local_1b0,&local_388,": ");
      std::operator+(&local_190,&local_1b0,&local_338);
      std::__cxx11::string::append((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_388);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"",(allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  BuildStructConstructor(this,pSVar5);
  BuildObjectConstructor(this,&local_2c8,&local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"",(allocator<char> *)&local_338);
  BuildObjectConstructor(this,&local_2a8,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
    GenerateObjectAPIStructConstructor(this,pSVar5);
  }
  for (ppFVar8 = (pSVar5->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar8 !=
      (local_348->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar8 = ppFVar8 + 1) {
    pFVar4 = *ppFVar8;
    if (pFVar4->deprecated == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"FIELDVAR",(allocator<char> *)&local_310);
      (*(local_318->super_Namer)._vptr_Namer[7])(&local_338,local_318,pFVar4);
      CodeWriter::SetValue(this_00,&local_388,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"VALUETYPE",(allocator<char> *)&local_310);
      GenType_abi_cxx11_(&local_338,this,&(pFVar4->value).type,false);
      CodeWriter::SetValue(this_00,&local_388,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_388);
      GenComment(this,&(pFVar4->super_Definition).doc_comment);
      if (((pFVar4->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (pFVar4->value).type.base_type - BASE_TYPE_UTYPE)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"",(allocator<char> *)&local_310);
        GenReaderMainBody(&local_388,this,&local_338);
        std::operator+(&local_70,&local_388,"_{{FIELDVAR}} }");
        CodeWriter::operator+=(this_00,&local_70);
        this_01 = &local_70;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"",(allocator<char> *)&local_310);
        GenReaderMainBody(&local_388,this,&local_338);
        std::operator+(&local_90,&local_388,"{{VALUETYPE}}(rawValue: _{{FIELDVAR}})! }");
        CodeWriter::operator+=(this_00,&local_90);
        this_01 = &local_90;
      }
      std::__cxx11::string::~string((string *)this_01);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_338);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"",(allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_1f0);
  pSVar5 = local_348;
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "{{ACCESS_TYPE}} static func verify<T>(_ verifier: inout Verifier, at position: Int, of type: T.Type) throws where T: Verifiable {"
             ,(allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "try verifier.inBuffer(position: position, of: {{STRUCTNAME}}.self)",
             (allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  iVar3 = (this->code_).cur_ident_lvl_;
  if (iVar3 != 0) {
    (this->code_).cur_ident_lvl_ = iVar3 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"}",(allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  iVar3 = (this->code_).cur_ident_lvl_;
  if (iVar3 != 0) {
    (this->code_).cur_ident_lvl_ = iVar3 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"}\n",(allocator<char> *)&local_388);
  CodeWriter::operator+=(this_00,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if ((((this->super_BaseGenerator).parser_)->opts).gen_json_coders == true) {
    GenerateJSONEncodingAPIs(this,pSVar5);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  std::__cxx11::string::~string((string *)&local_368);
  return;
}

Assistant:

void GenStructReader(const StructDef &struct_def) {
    const bool is_private_access =
        parser_.opts.swift_implementation_only ||
        struct_def.attributes.Lookup("private") != nullptr;
    code_.SetValue("ACCESS_TYPE", is_private_access ? "internal" : "public");
    GenComment(struct_def.doc_comment);
    code_.SetValue("STRUCTNAME", namer_.NamespacedType(struct_def));
    code_ +=
        "{{ACCESS_TYPE}} struct {{STRUCTNAME}}: NativeStruct, Verifiable, "
        "FlatbuffersInitializable\\";
    if (parser_.opts.generate_object_based_api) code_ += ", NativeObject\\";
    code_ += " {";
    code_ += "";
    Indent();
    code_ += ValidateFunc();
    code_ += "";
    int padding_id = 0;
    std::string constructor = "";
    std::vector<std::string> base_constructor;
    std::vector<std::string> main_constructor;

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;

      if (!constructor.empty()) constructor += ", ";

      const auto field_var = namer_.Variable(field);
      const auto type = GenType(field.value.type);
      code_.SetValue("FIELDVAR", field_var);
      if (IsEnum(field.value.type)) {
        code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      }
      code_.SetValue("VALUETYPE", type);
      GenComment(field.doc_comment);
      std::string valueType =
          IsEnum(field.value.type) ? "{{BASEVALUE}}" : "{{VALUETYPE}}";
      code_ += "private var _{{FIELDVAR}}: " + valueType;
      const auto accessing_value = IsEnum(field.value.type) ? ".value" : "";
      const auto base_value =
          IsStruct(field.value.type) ? (type + "()") : SwiftConstant(field);

      main_constructor.push_back("_" + field_var + " = " + field_var +
                                 accessing_value);
      base_constructor.push_back("_" + field_var + " = " + base_value);

      if (field.padding) { GenPadding(field, &padding_id); }
      constructor += field_var + ": " + type;
    }
    code_ += "";
    BuildStructConstructor(struct_def);
    BuildObjectConstructor(main_constructor, constructor);
    BuildObjectConstructor(base_constructor, "");

    if (parser_.opts.generate_object_based_api)
      GenerateObjectAPIStructConstructor(struct_def);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      GenComment(field.doc_comment);
      if (!IsEnum(field.value.type)) {
        code_ += GenReaderMainBody() + "_{{FIELDVAR}} }";
      } else if (IsEnum(field.value.type)) {
        code_ +=
            GenReaderMainBody() + "{{VALUETYPE}}(rawValue: _{{FIELDVAR}})! }";
      }
    }
    code_ += "";
    code_ +=
        "{{ACCESS_TYPE}} static func verify<T>(_ verifier: inout Verifier, at "
        "position: "
        "Int, of type: T.Type) throws where T: Verifiable {";
    Indent();
    code_ +=
        "try verifier.inBuffer(position: position, of: {{STRUCTNAME}}.self)";
    Outdent();
    code_ += "}";
    Outdent();
    code_ += "}\n";
    if (parser_.opts.gen_json_coders) GenerateJSONEncodingAPIs(struct_def);
  }